

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

ObjFunction * compile(char *source)

{
  _Bool _Var1;
  ObjFunction *pOVar2;
  char *in_RDI;
  ObjFunction *function;
  Compiler compiler;
  undefined8 in_stack_ffffffffffffddc8;
  FunctionType type;
  Compiler *in_stack_ffffffffffffddd0;
  
  type = (FunctionType)((ulong)in_stack_ffffffffffffddc8 >> 0x20);
  initScanner(in_RDI);
  initCompiler(in_stack_ffffffffffffddd0,type);
  parser.hadError = false;
  parser.panicMode = false;
  advance();
  while (_Var1 = match(0x106638), ((_Var1 ^ 0xffU) & 1) != 0) {
    declaration();
  }
  pOVar2 = endCompiler();
  if ((parser.hadError & 1U) != 0) {
    pOVar2 = (ObjFunction *)0x0;
  }
  return pOVar2;
}

Assistant:

ObjFunction *compile(const char *source) {
    initScanner(source);
    Compiler compiler;
    initCompiler(&compiler, TYPE_SCRIPT);
    parser.hadError = false;
    parser.panicMode = false;
    advance();
    while (!match(TOKEN_EOF)) {
        declaration();
    }
    ObjFunction *function = endCompiler();
    return parser.hadError ? NULL : function;
}